

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distortion.cc
# Opt level: O1

int __thiscall
gmath::RationalTangentialDistortion::clone
          (RationalTangentialDistortion *this,__fn *__fn,void *__child_stack,int __flags,void *__arg
          ,...)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  RationalTangentialDistortion *this_00;
  
  this_00 = (RationalTangentialDistortion *)operator_new(0x48);
  RationalTangentialDistortion(this_00);
  dVar1 = this->kd[0];
  dVar2 = this->kd[1];
  dVar3 = this->kd[2];
  dVar4 = this->kd[3];
  dVar5 = this->kd[4];
  dVar6 = this->kd[5];
  dVar7 = this->kd[7];
  this_00->kd[6] = this->kd[6];
  this_00->kd[7] = dVar7;
  this_00->kd[4] = dVar5;
  this_00->kd[5] = dVar6;
  this_00->kd[2] = dVar3;
  this_00->kd[3] = dVar4;
  this_00->kd[0] = dVar1;
  this_00->kd[1] = dVar2;
  return (int)this_00;
}

Assistant:

Distortion *RationalTangentialDistortion::clone() const
{
  RationalTangentialDistortion *ret=new RationalTangentialDistortion();

  for (int i=0; i<8; i++)
  {
    ret->kd[i]=kd[i];
  }

  return ret;
}